

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

NamedVar * __thiscall
despot::Parser::CreateObsVar(NamedVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_ObsVar)

{
  int num;
  char *pcVar1;
  TiXmlNode *pTVar2;
  TiXmlElement *pTVar3;
  string value_enum_list;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string local_d8;
  string local_b8;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  NamedVar::NamedVar(__return_storage_ptr__);
  pcVar1 = util::tinyxml::TiXmlElement::Attribute(e_ObsVar,"vname");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,pcVar1,(allocator<char> *)&local_d8);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_58,local_50 + (long)local_58);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name_);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  pTVar2 = util::tinyxml::TiXmlNode::FirstChild(&e_ObsVar->super_TiXmlNode,"ValueEnum");
  if (pTVar2 == (TiXmlNode *)0x0) {
    pTVar3 = util::tinyxml::TiXmlNode::FirstChildElement(&e_ObsVar->super_TiXmlNode,"NumValues");
    pcVar1 = util::tinyxml::TiXmlElement::GetText(pTVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,pcVar1,(allocator<char> *)&local_b8);
    num = atoi(local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"o","");
    Variable::values(&__return_storage_ptr__->super_Variable,&local_98,num);
    local_d8._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0014ea92;
  }
  else {
    pTVar3 = util::tinyxml::TiXmlNode::FirstChildElement(&e_ObsVar->super_TiXmlNode,"ValueEnum");
    pcVar1 = util::tinyxml::TiXmlElement::GetText(pTVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,pcVar1,(allocator<char> *)&local_b8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," ","");
    Tokenize(&local_38,&local_d8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    Variable::values(&__return_storage_ptr__->super_Variable,&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    local_98.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0014ea92;
  }
  operator_delete(local_d8._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
LAB_0014ea92:
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ObsVar Parser::CreateObsVar(TiXmlElement* e_ObsVar) {
	ObsVar obs;

	// <vname>
	string name = e_ObsVar->Attribute("vname");
	obs.name(name);

	// <ValueEnum> or <NumValues>
	if (e_ObsVar->FirstChild("ValueEnum")) {
		string value_enum_list = GetFirstChildText(e_ObsVar, "ValueEnum");
		vector<string> values = Tokenize(value_enum_list);
		obs.values(values);
	} else {
		int num = atoi(GetFirstChildText(e_ObsVar, "NumValues").c_str());
		obs.values("o", num);
	}

	return obs;
}